

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O1

void __thiscall
hungarian_algorithm::
BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
::doSolve(BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
          *this,size_t row,CombinedCost *accumulated_cost)

{
  ulong *puVar1;
  matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
  *pmVar2;
  ulong uVar3;
  size_type i;
  const_reference pdVar4;
  ulong j;
  long lVar5;
  ulong uVar6;
  CombinedCost new_accumulated_cost;
  CombinedCost local_40;
  
  if (row < this->num_rows_) {
    uVar3 = this->num_cols_;
    if (uVar3 != 0) {
      j = 0;
      do {
        uVar3 = j + 0x3f;
        if (-1 < (long)j) {
          uVar3 = j;
        }
        lVar5 = (long)uVar3 >> 6;
        uVar3 = (ulong)((j & 0x800000000000003f) < 0x8000000000000001);
        uVar6 = 1L << ((byte)j & 0x3f);
        if (((this->covered_cols_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [lVar5 + uVar3 + 0xffffffffffffffff] >> (j & 0x3f) & 1) == 0) {
          pmVar2 = this->cost_function_;
          i = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                        (row,pmVar2->size1_,j,pmVar2->size2_);
          pdVar4 = boost::numeric::ublas::
                   unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                   ::operator[](&pmVar2->data_,i);
          local_40.second.rep_ = pdVar4->rep_ + (accumulated_cost->second).rep_;
          local_40.first = accumulated_cost->first;
          (this->current_assignment_).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[row] = j;
          puVar1 = (this->covered_cols_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   lVar5 + uVar3 + 0xffffffffffffffff;
          *puVar1 = *puVar1 | uVar6;
          doSolve(this,row + 1,&local_40);
          puVar1 = (this->covered_cols_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   lVar5 + uVar3 + 0xffffffffffffffff;
          *puVar1 = *puVar1 & ~uVar6;
        }
        j = j + 1;
        uVar3 = this->num_cols_;
      } while (j < uVar3);
    }
    if (uVar3 < this->num_rows_) {
      local_40.first = accumulated_cost->first + 1;
      local_40.second.rep_ = (accumulated_cost->second).rep_;
      (this->current_assignment_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[row] = uVar3;
      doSolve(this,row + 1,&local_40);
    }
  }
  else {
    uVar3 = (this->optimal_cost_).first;
    if ((accumulated_cost->first < uVar3) ||
       ((accumulated_cost->first == uVar3 &&
        ((this->optimal_cost_).second.rep_ < (accumulated_cost->second).rep_)))) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&this->optimal_assignment_,&this->current_assignment_);
      (this->optimal_cost_).first = accumulated_cost->first;
      if (&this->optimal_cost_ != accumulated_cost) {
        (this->optimal_cost_).second.rep_ = (accumulated_cost->second).rep_;
      }
    }
  }
  return;
}

Assistant:

void doSolve(const std::size_t row, const CombinedCost& accumulated_cost)
  {
    if (row < num_rows_)
    {
      for (std::size_t col = 0; col < num_cols_; ++col)
      {
        if (!covered_cols_[col])
        {
          const CombinedCost new_accumulated_cost(accumulated_cost.first,
                                                  accumulated_cost.second + cost_function_(Size(row), Size(col)));
          current_assignment_[row] = col;
          covered_cols_[col] = true;
          doSolve(row + 1, new_accumulated_cost);
          covered_cols_[col] = false;
        }
      }

      if (num_cols_ < num_rows_)
      {
        // One possibility is also an invalid assignment:
        const CombinedCost new_accumulated_cost(accumulated_cost.first + 1, accumulated_cost.second);
        current_assignment_[static_cast<std::size_t>(row)] = num_cols_;
        doSolve(row + 1, new_accumulated_cost);
      }
    }
    else if (isBetterThan(accumulated_cost, optimal_cost_))
    {
      optimal_assignment_ = current_assignment_;
      optimal_cost_ = accumulated_cost;
    }
  }